

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<int> * __thiscall QMap<int,_QWizardPage_*>::keys(QMap<int,_QWizardPage_*> *this)

{
  bool bVar1;
  QList<int> *in_RDI;
  
  bVar1 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
                      *)0x7c0cfd);
  if (bVar1) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>_>
                  *)0x7c0d26);
    QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
    ::keys((QMapData<std::map<int,_QWizardPage_*,_std::less<int>,_std::allocator<std::pair<const_int,_QWizardPage_*>_>_>_>
            *)this);
  }
  else {
    memset(in_RDI,0,0x18);
    QList<int>::QList((QList<int> *)0x7c0d1a);
  }
  return in_RDI;
}

Assistant:

QList<Key> keys() const
    {
        if (!d)
            return {};
        return d->keys();
    }